

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KktChStep.cpp
# Opt level: O2

void __thiscall
KktChStep::addChange(KktChStep *this,int type,int row,int col,double valC,double dualC,double dualR)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer piVar4;
  double *pdVar5;
  long lVar6;
  pointer pdVar7;
  int iVar8;
  _Elt_pointer pvVar9;
  bool bVar10;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> upd;
  
  upd.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  upd.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  upd.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  switch(type) {
  case 0:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    break;
  case 1:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    if ((valC != 0.0) || (NAN(valC))) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->cLowers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->cLowers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->cLowers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->cUppers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->cUppers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->cUppers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
    }
    break;
  case 2:
    lVar6 = (long)col;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[lVar6] = dualC;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6] = 1;
    pdVar7 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    goto LAB_0014f544;
  case 3:
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    if ((valC != 0.0) || (NAN(valC))) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->rLowers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->rLowers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->rLowers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->rUppers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->rUppers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->rUppers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
    }
    break;
  case 4:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    break;
  case 5:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->cLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cLowers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->cUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cUppers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    break;
  case 6:
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    if ((valC != 0.0) || (NAN(valC))) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->rLowers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->rLowers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->rLowers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->rUppers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->rUppers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->rUppers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
    }
    break;
  case 7:
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    if ((valC != 0.0) || (NAN(valC))) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->rLowers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->rLowers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->rLowers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pvVar9 == (this->rUppers).c.
                    super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pvVar9 = (this->rUppers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
      }
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                (&upd,pvVar9 + -1);
      std::
      deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
      ::pop_back(&(this->rUppers).c);
      lVar6 = (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)upd.
                    super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
      pdVar7 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = &(upd.
                 super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->second;
      while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
        pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
        pdVar5 = pdVar5 + 2;
      }
    }
    break;
  case 8:
  case 9:
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x12:
  case 0x13:
  case 0x14:
    break;
  case 0xb:
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    lVar6 = (long)row;
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar6] = 1;
    pdVar7 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    dualC = dualR;
    goto LAB_0014f8ef;
  case 0xc:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->cLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cLowers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->cUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cUppers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    break;
  case 0x11:
    (this->flagRow).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[row] = 1;
    (this->flagCol).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[col] = 1;
    (this->colValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = valC;
    (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[col] = dualC;
    (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_start[row] = dualR;
    pvVar9 = (this->cLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cLowers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->cUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->cUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->cUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->cUppers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->costs).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->costs).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->costs).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->costs).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RcolCost).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    break;
  case 0x15:
    lVar6 = (long)row;
    pdVar7 = (this->rowDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
LAB_0014f544:
    pdVar7[lVar6] = dualR;
    break;
  case 0x16:
    pvVar9 = (this->rLowers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rLowers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rLowers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rLowers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    pvVar9 = (this->rUppers).c.
             super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar9 == (this->rUppers).c.
                  super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      pvVar9 = (this->rUppers).c.
               super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
              (&upd,pvVar9 + -1);
    std::
    deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
    ::pop_back(&(this->rUppers).c);
    lVar6 = (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)upd.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 4;
    pdVar7 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = &(upd.
               super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->second;
    while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
      pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
      pdVar5 = pdVar5 + 2;
    }
    break;
  default:
    if (type != 0x79) {
      if (type == 0xad) {
        piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar4 = (this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[row];
        lVar6 = (long)iVar1;
        iVar2 = piVar3[(long)row + 1];
        iVar8 = iVar2;
        if (iVar2 < iVar1) {
          iVar8 = iVar1;
        }
        for (; lVar6 < iVar2; lVar6 = lVar6 + 1) {
          if (piVar4[lVar6] == col) {
            iVar8 = (int)lVar6;
            break;
          }
        }
        (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = valC;
        piVar4[iVar8] = (int)dualC;
      }
      else if (type == 0xac) {
        piVar3 = (this->ARstart).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar1 = piVar3[row];
        lVar6 = (long)iVar1;
        iVar2 = piVar3[(long)row + 1];
        iVar8 = iVar2;
        if (iVar2 < iVar1) {
          iVar8 = iVar1;
        }
        for (; lVar6 < iVar2; lVar6 = lVar6 + 1) {
          if ((this->ARindex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6] == col) {
            iVar8 = (int)lVar6;
            break;
          }
        }
        (this->ARvalue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar8] = valC;
      }
      else if (type == 0xab) {
        pvVar9 = (this->rLowers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pvVar9 == (this->rLowers).c.
                      super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pvVar9 = (this->rLowers).c.
                   super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                  (&upd,pvVar9 + -1);
        std::
        deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
        ::pop_back(&(this->rLowers).c);
        lVar6 = (long)upd.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)upd.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
        pdVar7 = (this->RrowLower).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = &(upd.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second;
        while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
          pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
          pdVar5 = pdVar5 + 2;
        }
        pvVar9 = (this->rUppers).c.
                 super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pvVar9 == (this->rUppers).c.
                      super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          pvVar9 = (this->rUppers).c.
                   super__Deque_base<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
        }
        std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator=
                  (&upd,pvVar9 + -1);
        std::
        deque<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
        ::pop_back(&(this->rUppers).c);
        lVar6 = (long)upd.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)upd.
                      super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4;
        pdVar7 = (this->RrowUpper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar5 = &(upd.
                   super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->second;
        while (bVar10 = lVar6 != 0, lVar6 = lVar6 + -1, bVar10) {
          pdVar7[((pair<int,_double> *)(pdVar5 + -1))->first] = *pdVar5;
          pdVar5 = pdVar5 + 2;
        }
      }
      break;
    }
    lVar6 = (long)col;
    pdVar7 = (this->colDual).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
LAB_0014f8ef:
    pdVar7[lVar6] = dualC;
  }
  std::_Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~_Vector_base
            (&upd.
              super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>);
  return;
}

Assistant:

void KktChStep::addChange(int type, int row, int col, double valC, double dualC, double dualR) {
//when updating fill new values for b, c, bounds in Rb RcolCost RcolUpper, RcolLower
	vector<pair<int, double>> upd;
	
	switch(type) {
	case 171: //new bounds from doubleton equation, retrieve old ones
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		break;
	case 172:{ //matrix transformation from doubleton equation, retrieve old value
		//here col is x, the value of which we are changing back.
		//valC is the old value of the x entry in the matrix
		int i = ARstart[row];
		while (i<ARstart[row+1] && ARindex[i]!= col) i++;
		ARvalue[i] = valC;
		break;
	}
	case 173:{ //matrix transformation from doubleton equation, retrieve old value
		//here col is x, the value of which we are changing back.
		//valC is the old value of the x entry in the matrix
		int i = ARstart[row];
		while (i<ARstart[row+1] && ARindex[i]!= col) i++;
		ARvalue[i] = valC;
		ARindex[i] = (int) dualC;
		break;
	}
	case 0:  //empty row
		flagRow[row] = 1;
		break;
	case 1:  //row singleton
		flagRow[row] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		if (valC != 0) {
			upd =  cLowers.top();
			cLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RcolLower[ind] = get<1>(upd[i]);
			}
			upd =  cUppers.top();
			cUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RcolUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 2: //each variable at forcing row: rowDual is cost here
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		RcolCost[col] = dualR;
		break;
	case 21: //
		rowDual[row] = dualR;
		break;
	case 22: //
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		break;
	case 3: //the row that is forcing 
		rowDual[row] = dualR;
		flagRow[row] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 4: //implied free column singleton (also from duplicate row)
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 5: //doubleton eq with singleton col
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 17: {//doubleton equation
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
		upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	}
	case 6: //empty column, dominated column or weakly dominated
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 7: //fixed variable
		colValue[col] = valC;
		colDual[col] = dualC;
		flagCol[col] = 1;
		if (valC != 0) {
			upd =  rLowers.top();
			rLowers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowLower[ind] = get<1>(upd[i]);
			}
			upd =  rUppers.top();
			rUppers.pop();
			for (size_t i=0;i<upd.size();i++) {
				int ind = get<0>(upd[i]);
				RrowUpper[ind] = get<1>(upd[i]);
			}
		}
		break;
	case 11: //empty row from duplucate rows
		upd =  rLowers.top();
		rLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowLower[ind] = get<1>(upd[i]);
		}
		upd =  rUppers.top();
		rUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RrowUpper[ind] = get<1>(upd[i]);
		}
		flagRow[row] = 1;
		rowDual[row] = dualR;
		break;
	case 12: //doubleton eq from dupliocate rows;
		flagRow[row] = 1;
		flagCol[col] = 1;
		colValue[col] = valC;
		colDual[col] = dualC;
		rowDual[row] = dualR;
				upd =  cLowers.top();
		cLowers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolLower[ind] = get<1>(upd[i]);
		}
		upd =  cUppers.top();
		cUppers.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolUpper[ind] = get<1>(upd[i]);
		}
		upd =  costs.top();
		costs.pop();
		for (size_t i=0;i<upd.size();i++) {
			int ind = get<0>(upd[i]);
			RcolCost[ind] = get<1>(upd[i]);
		}
		break;
	case 121: //
		colDual[col] = dualC;
		break;/*
	case 14: //two duplicate columns by one 
		colValue[col] = valC;
		colDual[col] = dualC;
		RcolLower = cLowers.top(); cLowers.pop();
		RcolUpper = cUppers.top(); cUppers.pop();
		break;
	case 15: //sing variable on initEq
		flagRow[row] = true;
		rowDual[row] = dualR;
		break;*/
	}
}